

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

void __thiscall lexer::Lexer::Lexer(Lexer *this,string *inp)

{
  Word *pWVar1;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  Word local_380;
  Word local_330;
  Word local_2e0;
  Word local_290;
  Word local_240;
  Word local_1f0;
  Word local_1a0;
  Word local_150;
  Word local_100;
  Word local_b0;
  Word local_60;
  
  this->line = 1;
  std::__cxx11::string::string((string *)&this->input,inp);
  this->readPosition = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"true",&local_4e1);
  pWVar1 = &local_60;
  Word::Word(pWVar1,TRUE,&local_3a0);
  reserve((Lexer *)pWVar1,&local_60);
  Word::~Word(&local_60);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"false",&local_4e1);
  pWVar1 = &local_b0;
  Word::Word(pWVar1,FALSE,&local_3c0);
  reserve((Lexer *)pWVar1,&local_b0);
  Word::~Word(&local_b0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"define",&local_4e1);
  pWVar1 = &local_100;
  Word::Word(pWVar1,DEFINE,&local_3e0);
  reserve((Lexer *)pWVar1,&local_100);
  Word::~Word(&local_100);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"declare",&local_4e1);
  pWVar1 = &local_150;
  Word::Word(pWVar1,DECLARE,&local_400);
  reserve((Lexer *)pWVar1,&local_150);
  Word::~Word(&local_150);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"init",&local_4e1);
  pWVar1 = &local_1a0;
  Word::Word(pWVar1,INIT,&local_420);
  reserve((Lexer *)pWVar1,&local_1a0);
  Word::~Word(&local_1a0);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"if",&local_4e1);
  pWVar1 = &local_1f0;
  Word::Word(pWVar1,IF,&local_440);
  reserve((Lexer *)pWVar1,&local_1f0);
  Word::~Word(&local_1f0);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"else",&local_4e1);
  pWVar1 = &local_240;
  Word::Word(pWVar1,ELSE,&local_460);
  reserve((Lexer *)pWVar1,&local_240);
  Word::~Word(&local_240);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"for",&local_4e1);
  pWVar1 = &local_290;
  Word::Word(pWVar1,FOR,&local_480);
  reserve((Lexer *)pWVar1,&local_290);
  Word::~Word(&local_290);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"return",&local_4e1);
  pWVar1 = &local_2e0;
  Word::Word(pWVar1,RETURN,&local_4a0);
  reserve((Lexer *)pWVar1,&local_2e0);
  Word::~Word(&local_2e0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"in",&local_4e1);
  pWVar1 = &local_330;
  Word::Word(pWVar1,IN,&local_4c0);
  reserve((Lexer *)pWVar1,&local_330);
  Word::~Word(&local_330);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"null",&local_4e1);
  pWVar1 = &local_380;
  Word::Word(pWVar1,NULLTOKEN,&local_4e0);
  reserve((Lexer *)pWVar1,&local_380);
  Word::~Word(&local_380);
  std::__cxx11::string::~string((string *)&local_4e0);
  return;
}

Assistant:

explicit Lexer(std::string inp):input{inp},readPosition{0}{
        reserve(Word(TokenType::TRUE, "true"));
        reserve(Word(TokenType::FALSE, "false"));
        reserve(Word(TokenType::DEFINE, "define"));
        reserve(Word(TokenType::DECLARE, "declare"));
        reserve(Word(TokenType::INIT, "init"));
        reserve(Word(TokenType::IF, "if"));
        reserve(Word(TokenType::ELSE, "else"));
        reserve(Word(TokenType::FOR, "for"));
        reserve(Word(TokenType::RETURN, "return"));
        reserve(Word(TokenType::IN, "in"));
        reserve(Word(TokenType::NULLTOKEN, "null"));
    }